

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

bool __thiscall Lowerer::GenerateFastBrBool(Lowerer *this,BranchInstr *instr)

{
  Opnd **ppOVar1;
  short sVar2;
  LabelInstr *target;
  ScriptContextInfo *pSVar3;
  code *pcVar4;
  LabelInstr *target_00;
  Func *pFVar5;
  bool bVar6;
  OpndKind OVar7;
  bool bVar8;
  bool bVar9;
  ObjectType OVar10;
  int iVar11;
  uint32 uVar12;
  undefined4 *puVar13;
  Instr *pIVar14;
  Func *pFVar15;
  LabelInstr *target_01;
  LabelInstr *target_02;
  undefined4 extraout_var;
  AddrOpnd *pAVar16;
  undefined4 extraout_var_00;
  RegOpnd *pRVar17;
  Lowerer *pLVar18;
  undefined4 extraout_var_02;
  IndirOpnd *pIVar19;
  IntConstOpnd *pIVar20;
  OpCode OVar21;
  Lowerer *pLVar22;
  undefined1 local_f8 [8];
  AutoReuseOpnd autoReuseSrc;
  anon_class_48_6_08bc57de EnsureObjectTest;
  AutoReuseOpnd autoReuseToBoolDst;
  LabelInstr *local_78;
  LabelInstr *labelHelper;
  Lowerer *local_68;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_5a;
  Func *pFStack_58;
  ValueType srcOriginalValueType;
  Func *func;
  RegOpnd *src;
  Func *pFStack_40;
  bool _didObjectTest;
  BranchInstr *instr_local;
  ValueType srcValueType;
  undefined4 extraout_var_01;
  
  labelHelper = (LabelInstr *)this;
  pFStack_40 = (Func *)instr;
  if (instr == (BranchInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5fc9,"(instr)","instr");
    if (!bVar6) goto LAB_005bbac6;
    *puVar13 = 0;
  }
  if ((*(OpCode *)&pFStack_40->constructorCacheCount & ~ExtendedOpcodePrefix) != BrFalse_A) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5fca,
                       "(instr->m_opcode == Js::OpCode::BrFalse_A || instr->m_opcode == Js::OpCode::BrTrue_A)"
                       ,
                       "instr->m_opcode == Js::OpCode::BrFalse_A || instr->m_opcode == Js::OpCode::BrTrue_A"
                      );
    if (!bVar6) goto LAB_005bbac6;
    *puVar13 = 0;
  }
  pFStack_58 = ((LowererMDArch *)&pFStack_40->m_workItem)->m_func;
  OVar7 = IR::Opnd::GetKind((Opnd *)pFStack_40->singleTypeGuards);
  if (OVar7 != OpndKindReg) {
    pIVar14 = IR::Instr::HoistSrc1((Instr *)pFStack_40,Ld_A,RegNOREG,(StackSym *)0x0);
    LowererMD::ChangeToAssign(pIVar14);
  }
  pFVar15 = (Func *)IR::Opnd::Copy((Opnd *)pFStack_40->singleTypeGuards,pFStack_58);
  OVar7 = IR::Opnd::GetKind((Opnd *)pFVar15);
  if (OVar7 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar6) goto LAB_005bbac6;
    *puVar13 = 0;
  }
  local_f8 = (undefined1  [8])0x0;
  func = pFVar15;
  IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_f8,(Opnd *)pFVar15,pFStack_58,true);
  local_5a = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&func->m_runtimeInfo;
  target = (LabelInstr *)pFStack_40->callSiteToArgumentsOffsetFixupMap;
  instr_local._6_2_ = local_5a;
  target_01 = IR::Instr::GetOrCreateContinueLabel((Instr *)pFStack_40,false);
  if (target == target_01) {
    IR::Instr::Remove((Instr *)pFStack_40);
    goto LAB_005bae23;
  }
  sVar2 = (short)pFStack_40->constructorCacheCount;
  target_02 = target_01;
  target_00 = target;
  if (sVar2 != 0xe) {
    target_02 = target;
    target_00 = target_01;
  }
  if (*(IRType *)((ValueType *)&pFStack_40->singleTypeGuards->entries + 1) == TyFloat64) {
    InsertFloatCheckForZeroOrNanBranch
              ((Lowerer *)pFStack_40,(Opnd *)pFStack_40->singleTypeGuards,sVar2 == 0xe,target,
               target_01,(Instr *)pFStack_40);
    InsertBranch(Br,false,target_01,(Instr *)pFStack_40);
  }
  else {
    bVar6 = ValueType::HasBeenNull((ValueType *)((long)&instr_local + 6));
    if ((!bVar6) && (bVar6 = ValueType::IsUninitialized((ValueType *)&local_5a.field_0), !bVar6)) {
LAB_005bad72:
      bVar6 = ValueType::HasBeenUndefined((ValueType *)((long)&instr_local + 6));
      if ((bVar6) || (bVar6 = ValueType::IsUninitialized((ValueType *)&local_5a.field_0), bVar6)) {
        bVar6 = ValueType::IsUndefined((ValueType *)((long)&instr_local + 6));
        pFVar5 = pFStack_40;
        pFVar15 = func;
        if (bVar6) {
          InsertBranch(Br,false,target_00,(Instr *)pFStack_40);
          if (*(IRKind *)
               ((long)(((Lowerer *)pFStack_40->m_scriptContextInfo)->m_lowererMD).lowererMDArch.
                      helperCallArgs + 1) == InstrKindBranch) goto LAB_005bae1a;
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x6016,"(instr->m_prev->IsBranchInstr())",
                             "instr->m_prev->IsBranchInstr()");
          goto LAB_005bae0c;
        }
        iVar11 = (*((LowererMDArch *)&pFStack_40->m_workItem)->m_func->m_scriptContextInfo->
                   _vptr_ScriptContextInfo[1])();
        pLVar22 = (Lowerer *)CONCAT44(extraout_var_00,iVar11);
        pAVar16 = IR::AddrOpnd::New((intptr_t)pLVar22,AddrOpndKindDynamicVar,
                                    ((LowererMDArch *)&pFVar5->m_workItem)->m_func,true,(Var)0x0);
        InsertCompareBranch(pLVar22,(Opnd *)pFVar15,&pAVar16->super_Opnd,BrEq_A,false,target_00,
                            (Instr *)pFStack_40,false);
        pFVar15 = func;
        instr_local._6_2_ =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::SetIsNotAnyOf((ValueType *)((long)&instr_local + 6),(ValueType)0x2);
        IR::Opnd::SetValueType((Opnd *)pFVar15,(ValueType)instr_local._6_2_);
      }
      bVar6 = IR::Opnd::IsNotInt((Opnd *)func);
      bVar8 = ValueType::HasBeenInt((ValueType *)((long)&instr_local + 6));
      OVar21 = sVar2 == 0xe ^ BrNeq_A;
      if ((bVar8) ||
         (bVar8 = ValueType::HasBeenUnknownNumber((ValueType *)((long)&instr_local + 6)), bVar8)) {
        if (bVar6) goto LAB_005baef1;
LAB_005baf0f:
        bVar6 = IR::Opnd::IsTaggedInt((Opnd *)func);
        if (bVar6) {
          local_68 = (Lowerer *)0x0;
        }
        else {
          local_68 = (Lowerer *)IR::LabelInstr::New(Label,pFStack_58,false);
          LowererMD::GenerateSmIntTest
                    ((LowererMD *)&(labelHelper->super_Instr).m_noLazyHelperAssert,(Opnd *)func,
                     (Instr *)pFStack_40,(LabelInstr *)local_68,(Instr **)0x0,false);
        }
        LowererMD::GenerateTaggedZeroTest
                  ((LowererMD *)&(labelHelper->super_Instr).m_noLazyHelperAssert,(Opnd *)func,
                   (Instr *)pFStack_40,(LabelInstr *)0x0);
        InsertBranch(OVar21,false,target,(Instr *)pFStack_40);
        bVar8 = IR::Opnd::IsTaggedInt((Opnd *)func);
        if (bVar8) {
          if (*(IRKind *)
               ((long)(((Lowerer *)pFStack_40->m_scriptContextInfo)->m_lowererMD).lowererMDArch.
                      helperCallArgs + 1) != InstrKindBranch) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar13 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x6044,"(instr->m_prev->IsBranchInstr())",
                               "instr->m_prev->IsBranchInstr()");
            if (!bVar6) goto LAB_005bbac6;
            *puVar13 = 0;
          }
          IR::Instr::Remove((Instr *)pFStack_40);
LAB_005bb025:
          local_68 = (Lowerer *)0x0;
        }
        else {
          InsertBranch(Br,false,target_01,(Instr *)pFStack_40);
          if (local_68 == (Lowerer *)0x0) goto LAB_005bb025;
          IR::Instr::InsertBefore((Instr *)pFStack_40,(Instr *)local_68);
        }
        bVar6 = true;
        if (bVar8) goto LAB_005bae23;
      }
      else {
        bVar8 = ValueType::IsUninitialized((ValueType *)&local_5a.field_0);
        if (!bVar6 && bVar8) goto LAB_005baf0f;
LAB_005baef1:
        local_68 = (Lowerer *)0x0;
      }
      bVar8 = ValueType::IsLikelyFloat((ValueType *)((long)&instr_local + 6));
      bVar9 = ValueType::IsNotNumber((ValueType *)((long)&instr_local + 6));
      if (bVar8) {
        local_68 = (Lowerer *)IR::LabelInstr::New(Label,pFStack_58,false);
        if (bVar6 == false) {
          bVar6 = true;
          LowererMD::GenerateSmIntTest
                    ((LowererMD *)&(labelHelper->super_Instr).m_noLazyHelperAssert,(Opnd *)func,
                     (Instr *)pFStack_40,(LabelInstr *)local_68,(Instr **)0x0,true);
        }
        pLVar22 = (Lowerer *)&(labelHelper->super_Instr).m_noLazyHelperAssert;
        pRVar17 = LowererMD::CheckFloatAndUntag
                            ((LowererMD *)pLVar22,(RegOpnd *)func,(Instr *)pFStack_40,
                             (LabelInstr *)local_68);
        InsertFloatCheckForZeroOrNanBranch
                  (pLVar22,&pRVar17->super_Opnd,sVar2 == 0xe,target,target_01,(Instr *)pFStack_40);
        InsertBranch(Br,false,target_01,(Instr *)pFStack_40);
        IR::Instr::InsertBefore((Instr *)pFStack_40,(Instr *)local_68);
        pFVar15 = func;
        instr_local._6_2_ =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::SetIsNotAnyOf((ValueType *)((long)&instr_local + 6),(ValueType)0x3e0);
        bVar9 = true;
        IR::Opnd::SetValueType((Opnd *)pFVar15,(ValueType)instr_local._6_2_);
      }
      src._7_1_ = bVar9 & bVar6;
      EnsureObjectTest._didObjectTest = (bool *)&local_78;
      local_78 = (LabelInstr *)0x0;
      autoReuseSrc._16_8_ = (long)&src + 7;
      EnsureObjectTest.labelHelper = (LabelInstr **)&stack0xffffffffffffffa8;
      EnsureObjectTest.func = (Func **)labelHelper;
      EnsureObjectTest.this = (Lowerer *)&func;
      EnsureObjectTest.src = (RegOpnd **)&stack0xffffffffffffffc0;
      bVar6 = ValueType::HasBeenBoolean((ValueType *)((long)&instr_local + 6));
      if ((bVar6) || (bVar6 = ValueType::IsUninitialized((ValueType *)&local_5a.field_0), bVar6)) {
        bVar6 = ValueType::IsBoolean((ValueType *)((long)&instr_local + 6));
        if (bVar6) {
          pLVar22 = (Lowerer *)0x0;
        }
        else {
          if (src._7_1_ == 0) {
            if (local_78 == (LabelInstr *)0x0) {
              local_78 = IR::LabelInstr::New(Label,pFStack_58,true);
            }
            LowererMD::GenerateObjectTest
                      ((LowererMD *)&(labelHelper->super_Instr).m_noLazyHelperAssert,(Opnd *)func,
                       (Instr *)pFStack_40,local_78,false);
            src._7_1_ = 1;
          }
          pLVar22 = (Lowerer *)IR::LabelInstr::New(Label,pFStack_58,false);
          pIVar19 = IR::IndirOpnd::New((RegOpnd *)func,0,TyUint64,pFStack_58,false);
          pSVar3 = ((LowererMDArch *)&pFStack_40->m_workItem)->m_func->m_scriptContextInfo;
          iVar11 = (*pSVar3->_vptr_ScriptContextInfo[0x21])(pSVar3,6);
          pLVar18 = (Lowerer *)CONCAT44(extraout_var_01,iVar11);
          pAVar16 = IR::AddrOpnd::New(pLVar18,AddrOpndKindDynamicVtable,
                                      (Func *)(labelHelper->super_Instr)._vptr_Instr,false,(Var)0x0)
          ;
          InsertCompareBranch(pLVar18,&pIVar19->super_Opnd,&pAVar16->super_Opnd,BrNeq_A,false,
                              (LabelInstr *)pLVar22,(Instr *)pFStack_40,false);
        }
        pFVar5 = pFStack_40;
        pFVar15 = func;
        iVar11 = (*((LowererMDArch *)&pFStack_40->m_workItem)->m_func->m_scriptContextInfo->
                   _vptr_ScriptContextInfo[3])();
        pLVar18 = (Lowerer *)CONCAT44(extraout_var_02,iVar11);
        pAVar16 = IR::AddrOpnd::New((intptr_t)pLVar18,AddrOpndKindDynamicVar,
                                    ((LowererMDArch *)&pFVar5->m_workItem)->m_func,true,(Var)0x0);
        InsertCompareBranch(pLVar18,(Opnd *)pFVar15,&pAVar16->super_Opnd,OVar21,false,target,
                            (Instr *)pFStack_40,false);
        bVar6 = ValueType::IsBoolean((ValueType *)((long)&instr_local + 6));
        if (bVar6) {
          if (local_78 != (LabelInstr *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar13 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x60bc,"(!labelHelper)","!labelHelper");
            if (!bVar8) goto LAB_005bbac6;
            *puVar13 = 0;
          }
          if (*(IRKind *)
               ((long)(((Lowerer *)pFStack_40->m_scriptContextInfo)->m_lowererMD).lowererMDArch.
                      helperCallArgs + 1) != InstrKindBranch) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar13 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x60bd,"(instr->m_prev->IsBranchInstr())",
                               "instr->m_prev->IsBranchInstr()");
            if (!bVar8) goto LAB_005bbac6;
            *puVar13 = 0;
          }
          IR::Instr::Remove((Instr *)pFStack_40);
        }
        else {
          InsertBranch(Br,false,target_01,(Instr *)pFStack_40);
          if (pLVar22 != (Lowerer *)0x0) {
            IR::Instr::InsertBefore((Instr *)pFStack_40,(Instr *)pLVar22);
            local_68 = pLVar22;
          }
          pFVar15 = func;
          instr_local._6_2_ =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               ValueType::SetIsNotAnyOf((ValueType *)((long)&instr_local + 6),(ValueType)0x400);
          IR::Opnd::SetValueType((Opnd *)pFVar15,(ValueType)instr_local._6_2_);
        }
        if (bVar6) goto LAB_005bae23;
      }
      bVar6 = ValueType::HasBeenString((ValueType *)((long)&instr_local + 6));
      if (bVar6) {
        bVar6 = ValueType::IsString((ValueType *)((long)&instr_local + 6));
        if (bVar6) {
          pLVar22 = (Lowerer *)0x0;
        }
        else {
          GenerateFastBrBool::anon_class_48_6_08bc57de::operator()
                    ((anon_class_48_6_08bc57de *)&autoReuseSrc.autoDelete);
          pLVar22 = (Lowerer *)IR::LabelInstr::New(Label,pFStack_58,false);
          GenerateStringTest((Lowerer *)labelHelper,(RegOpnd *)func,(Instr *)pFStack_40,
                             (LabelInstr *)pLVar22,(LabelInstr *)0x0,false);
        }
        pIVar19 = IR::IndirOpnd::New((RegOpnd *)func,0x18,TyUint32,pFStack_58,false);
        pLVar18 = (Lowerer *)0x0;
        pIVar20 = IR::IntConstOpnd::New(0,TyUint32,pFStack_58,true);
        InsertCompareBranch(pLVar18,&pIVar19->super_Opnd,&pIVar20->super_Opnd,OVar21,false,target,
                            (Instr *)pFStack_40,false);
        bVar6 = ValueType::IsString((ValueType *)((long)&instr_local + 6));
        if (bVar6) {
          if (local_78 != (LabelInstr *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar13 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x60e8,"(!labelHelper)","!labelHelper");
            if (!bVar8) goto LAB_005bbac6;
            *puVar13 = 0;
          }
          if (*(IRKind *)
               ((long)(((Lowerer *)pFStack_40->m_scriptContextInfo)->m_lowererMD).lowererMDArch.
                      helperCallArgs + 1) != InstrKindBranch) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar13 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x60e9,"(instr->m_prev->IsBranchInstr())",
                               "instr->m_prev->IsBranchInstr()");
            if (!bVar8) goto LAB_005bbac6;
            *puVar13 = 0;
          }
          IR::Instr::Remove((Instr *)pFStack_40);
        }
        else {
          InsertBranch(Br,false,target_01,(Instr *)pFStack_40);
          if (pLVar22 != (Lowerer *)0x0) {
            IR::Instr::InsertBefore((Instr *)pFStack_40,(Instr *)pLVar22);
            local_68 = pLVar22;
          }
          pFVar15 = func;
          instr_local._6_2_ =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               ValueType::SetIsNotAnyOf((ValueType *)((long)&instr_local + 6),(ValueType)0x800);
          IR::Opnd::SetValueType((Opnd *)pFVar15,(ValueType)instr_local._6_2_);
        }
        if (bVar6) goto LAB_005bae23;
      }
      bVar6 = ValueType::IsLikelyObject((ValueType *)((long)&instr_local + 6));
      if (bVar6) {
        bVar6 = ValueType::IsObject((ValueType *)((long)&instr_local + 6));
        if (bVar6) {
          OVar10 = ValueType::GetObjectType((ValueType *)((long)&instr_local + 6));
          if (Object < OVar10) {
            InsertBranch(Br,false,target_02,(Instr *)pFStack_40);
            if (local_78 != (LabelInstr *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar13 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                 ,0x6108,"(!labelHelper)","!labelHelper");
              if (!bVar6) goto LAB_005bbac6;
              *puVar13 = 0;
            }
            if (*(IRKind *)
                 ((long)(((Lowerer *)pFStack_40->m_scriptContextInfo)->m_lowererMD).lowererMDArch.
                        helperCallArgs + 1) != InstrKindBranch) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar13 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                 ,0x6109,"(instr->m_prev->IsBranchInstr())",
                                 "instr->m_prev->IsBranchInstr()");
              if (!bVar6) goto LAB_005bbac6;
              *puVar13 = 0;
            }
            IR::Instr::Remove((Instr *)pFStack_40);
            goto LAB_005bae23;
          }
        }
        else {
          GenerateFastBrBool::anon_class_48_6_08bc57de::operator()
                    ((anon_class_48_6_08bc57de *)&autoReuseSrc.autoDelete);
        }
        pRVar17 = IR::RegOpnd::New(TyUint64,pFStack_58);
        EnsureObjectTest.instr = (BranchInstr **)0x0;
        IR::AutoReuseOpnd::Initialize
                  ((AutoReuseOpnd *)&EnsureObjectTest.instr,&pRVar17->super_Opnd,pFStack_58,true);
        pIVar19 = IR::IndirOpnd::New((RegOpnd *)func,8,TyUint64,pFStack_58,false);
        InsertMove(&pRVar17->super_Opnd,&pIVar19->super_Opnd,(Instr *)pFStack_40,true);
        uVar12 = Js::Type::GetOffsetOfFlags();
        pIVar19 = IR::IndirOpnd::New(pRVar17,uVar12,TyUint8,pFStack_58,false);
        pIVar20 = IR::IntConstOpnd::New(2,TyUint8,pFStack_58,false);
        pFVar15 = pFStack_40;
        InsertTest(&pIVar19->super_Opnd,&pIVar20->super_Opnd,(Instr *)pFStack_40);
        InsertBranch(BrNeq_A,false,target_00,(Instr *)pFVar15);
        uVar12 = Js::Type::GetOffsetOfTypeId();
        pIVar19 = IR::IndirOpnd::New(pRVar17,uVar12,TyInt32,pFStack_58,false);
        pLVar22 = (Lowerer *)0x16;
        pIVar20 = IR::IntConstOpnd::New(0x16,TyInt32,pFStack_58,false);
        InsertCompareBranch(pLVar22,&pIVar19->super_Opnd,&pIVar20->super_Opnd,BrGt_A,true,target_02,
                            (Instr *)pFStack_40,false);
        if (local_78 == (LabelInstr *)0x0) {
          local_78 = IR::LabelInstr::New(Label,pFStack_58,true);
        }
        IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&EnsureObjectTest.instr);
        local_68 = (Lowerer *)0x0;
      }
      if (local_68 != (Lowerer *)0x0) {
        if ((Lowerer *)pFStack_40->m_scriptContextInfo != local_68) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x6138,"(instr->m_prev == lastLabelBeforeHelper)",
                             "instr->m_prev == lastLabelBeforeHelper");
          if (!bVar6) goto LAB_005bbac6;
          *puVar13 = 0;
        }
        ppOVar1 = (local_68->m_lowererMD).lowererMDArch.helperCallArgs + 8;
        *(byte *)ppOVar1 = *(byte *)ppOVar1 | 2;
      }
      if (local_78 != (LabelInstr *)0x0) {
        if ((local_78->field_0x78 & 2) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x613d,"(labelHelper->isOpHelper)","labelHelper->isOpHelper");
          if (!bVar6) goto LAB_005bbac6;
          *puVar13 = 0;
        }
        IR::Instr::InsertBefore((Instr *)pFStack_40,&local_78->super_Instr);
      }
      pRVar17 = IR::RegOpnd::New(TyInt32,pFStack_58);
      EnsureObjectTest.instr = (BranchInstr **)0x0;
      IR::AutoReuseOpnd::Initialize
                ((AutoReuseOpnd *)&EnsureObjectTest.instr,&pRVar17->super_Opnd,pFStack_58,true);
      pIVar14 = IR::Instr::New(Call,&pRVar17->super_Opnd,(Opnd *)pFStack_40->singleTypeGuards,
                               pFStack_58);
      IR::Instr::InsertBefore((Instr *)pFStack_40,pIVar14);
      LoadScriptContext((Lowerer *)labelHelper,pIVar14);
      LowerUnaryHelper((Lowerer *)labelHelper,pIVar14,HelperConv_ToBoolean,(Opnd *)0x0);
      InsertTest(&pRVar17->super_Opnd,&pRVar17->super_Opnd,(Instr *)pFStack_40);
      if (*(IRKind *)((long)&pFStack_40->constructorCaches + 1) != InstrKindBranch) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x614c,"(instr->IsBranchInstr())","instr->IsBranchInstr()");
        if (!bVar6) goto LAB_005bbac6;
        *puVar13 = 0;
      }
      IR::Instr::FreeSrc1((Instr *)pFStack_40);
      OVar21 = LowererMD::MDBranchOpcode(OVar21);
      pFVar15 = pFStack_40;
      *(OpCode *)&pFStack_40->constructorCacheCount = OVar21;
      if (*(IRKind *)((long)&pFStack_40->constructorCaches + 1) != InstrKindBranch) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
        if (!bVar6) goto LAB_005bbac6;
        *puVar13 = 0;
      }
      if ((LabelInstr *)pFVar15->callSiteToArgumentsOffsetFixupMap != target) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x614f,"(instr->AsBranchInstr()->GetTarget() == labelTarget)",
                           "instr->AsBranchInstr()->GetTarget() == labelTarget");
        if (!bVar6) {
LAB_005bbac6:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar13 = 0;
      }
      IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&EnsureObjectTest.instr);
      goto LAB_005bae23;
    }
    bVar6 = ValueType::IsNull((ValueType *)((long)&instr_local + 6));
    pFVar5 = pFStack_40;
    pFVar15 = func;
    if (!bVar6) {
      iVar11 = (**((LowererMDArch *)&pFStack_40->m_workItem)->m_func->m_scriptContextInfo->
                  _vptr_ScriptContextInfo)();
      pLVar22 = (Lowerer *)CONCAT44(extraout_var,iVar11);
      pAVar16 = IR::AddrOpnd::New((intptr_t)pLVar22,AddrOpndKindDynamicVar,
                                  ((LowererMDArch *)&pFVar5->m_workItem)->m_func,true,(Var)0x0);
      InsertCompareBranch(pLVar22,(Opnd *)pFVar15,&pAVar16->super_Opnd,BrEq_A,false,target_00,
                          (Instr *)pFStack_40,false);
      pFVar15 = func;
      instr_local._6_2_ =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetIsNotAnyOf((ValueType *)((long)&instr_local + 6),(ValueType)0x4);
      IR::Opnd::SetValueType((Opnd *)pFVar15,(ValueType)instr_local._6_2_);
      goto LAB_005bad72;
    }
    InsertBranch(Br,false,target_00,(Instr *)pFStack_40);
    if (*(IRKind *)
         ((long)(((Lowerer *)pFStack_40->m_scriptContextInfo)->m_lowererMD).lowererMDArch.
                helperCallArgs + 1) == InstrKindBranch) goto LAB_005bae1a;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5ffa,"(instr->m_prev->IsBranchInstr())","instr->m_prev->IsBranchInstr()");
LAB_005bae0c:
    if (bVar6 == false) goto LAB_005bbac6;
    *puVar13 = 0;
  }
LAB_005bae1a:
  IR::Instr::Remove((Instr *)pFStack_40);
LAB_005bae23:
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_f8);
  return false;
}

Assistant:

bool Lowerer::GenerateFastBrBool(IR::BranchInstr *const instr)
{
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::BrFalse_A || instr->m_opcode == Js::OpCode::BrTrue_A);

    Func *const func = instr->m_func;

    if(!instr->GetSrc1()->IsRegOpnd())
    {
        LowererMD::ChangeToAssign(instr->HoistSrc1(Js::OpCode::Ld_A));
    }
    IR::RegOpnd *const src = instr->GetSrc1()->Copy(func)->AsRegOpnd();
    const IR::AutoReuseOpnd autoReuseSrc(src, func);
    const ValueType srcOriginalValueType(src->GetValueType());
    ValueType srcValueType(srcOriginalValueType);

    IR::LabelInstr *const labelTarget = instr->GetTarget();
    IR::LabelInstr *const labelFallthrough = instr->GetOrCreateContinueLabel();
    if(labelTarget == labelFallthrough)
    {
        // Nothing to do
        instr->Remove();
        return false;
    }

    const bool branchOnFalse = instr->m_opcode == Js::OpCode::BrFalse_A;
    IR::LabelInstr *const labelFalse = branchOnFalse ? labelTarget : labelFallthrough;
    IR::LabelInstr *const labelTrue = branchOnFalse ? labelFallthrough : labelTarget;
    const Js::OpCode compareWithFalseBranchToTargetOpCode = branchOnFalse ? Js::OpCode::BrEq_A : Js::OpCode::BrNeq_A;
    IR::LabelInstr *lastLabelBeforeHelper = nullptr;

    /// Typespec'd float
    if (instr->GetSrc1()->GetType() == TyFloat64)
    {
        InsertFloatCheckForZeroOrNanBranch(instr->GetSrc1(), branchOnFalse, labelTarget, labelFallthrough, instr);
        Lowerer::InsertBranch(Js::OpCode::Br, labelFallthrough, instr);
        instr->Remove();
        return false;
    }

    ////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    // Null fast path

    if (srcValueType.HasBeenNull() || srcOriginalValueType.IsUninitialized())
    {
        if(srcValueType.IsNull())
        {
            //     jmp $false
            InsertBranch(Js::OpCode::Br, labelFalse, instr);

            // Skip lowering call to helper
            Assert(instr->m_prev->IsBranchInstr());
            instr->Remove();
            return false;
        }

        //     cmp src, null
        //     je $false
        InsertCompareBranch(
            src,
            LoadLibraryValueOpnd(instr, LibraryValue::ValueNull),
            Js::OpCode::BrEq_A,
            labelFalse,
            instr);

        src->SetValueType(srcValueType = srcValueType.SetIsNotAnyOf(ValueType::Null));
    }

    ////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    // Undefined fast path

    if(srcValueType.HasBeenUndefined() || srcOriginalValueType.IsUninitialized())
    {
        if(srcValueType.IsUndefined())
        {
            //     jmp $false
            InsertBranch(Js::OpCode::Br, labelFalse, instr);

            // Skip lowering call to helper
            Assert(instr->m_prev->IsBranchInstr());
            instr->Remove();
            return false;
        }

        //     cmp src, undefined
        //     je $false
        InsertCompareBranch(
            src,
            LoadLibraryValueOpnd(instr, LibraryValue::ValueUndefined),
            Js::OpCode::BrEq_A,
            labelFalse,
            instr);

        src->SetValueType(srcValueType = srcValueType.SetIsNotAnyOf(ValueType::Undefined));
    }

    ////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    // Tagged int fast path

    const bool isNotInt = src->IsNotInt();
    bool checkedForTaggedInt = isNotInt;
    if( (
            srcValueType.HasBeenInt() ||
            srcValueType.HasBeenUnknownNumber() ||
            srcOriginalValueType.IsUninitialized()
        ) && !isNotInt)
    {
        checkedForTaggedInt = true;
        IR::LabelInstr *notTaggedIntLabel = nullptr;
        if(!src->IsTaggedInt())
        {
            //     test src, 1
            //     jz $notTaggedInt
            notTaggedIntLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
            m_lowererMD.GenerateSmIntTest(src, instr, notTaggedIntLabel);
        }

        //     cmp src, tag(0)
        //     je/jne $target
        m_lowererMD.GenerateTaggedZeroTest(src, instr);
        Lowerer::InsertBranch(compareWithFalseBranchToTargetOpCode, labelTarget, instr);

        if(src->IsTaggedInt())
        {
            // Skip lowering call to helper
            Assert(instr->m_prev->IsBranchInstr());
            instr->Remove();
            return false;
        }

        //     jmp $fallthrough
        Lowerer::InsertBranch(Js::OpCode::Br, labelFallthrough, instr);

        // $notTaggedInt:
        if(notTaggedIntLabel)
        {
            instr->InsertBefore(notTaggedIntLabel);
            lastLabelBeforeHelper = notTaggedIntLabel;
        }
    }

    ////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    // Float fast path

    bool generateFloatTest = srcValueType.IsLikelyFloat();
#ifdef _M_IX86
    if (!AutoSystemInfo::Data.SSE2Available())
    {
        generateFloatTest = false;
    }
#endif
    bool checkedForTaggedFloat =
#if FLOATVAR
        srcValueType.IsNotNumber();
#else
        true; // there are no tagged floats, indicate that it has been checked
#endif
    if (generateFloatTest)
    {
        // if(srcValueType.IsFloat()) // skip tagged int check?
        //
        // ValueType::IsFloat() does not guarantee that the storage is not in a tagged int.
        // The tagged int check is necessary. It does, however, guarantee that as long as the value is not
        // stored in a tagged int, that it is definitely stored in a JavascriptNumber/TaggedFloat.

        IR::LabelInstr *const notFloatLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
        if(!checkedForTaggedInt)
        {
            checkedForTaggedInt = true;
            m_lowererMD.GenerateSmIntTest(src, instr, notFloatLabel, nullptr, true);
        }

        //     cmp [src], JavascriptNumber::vtable
        //     jne $notFloat
    #if FLOATVAR
        checkedForTaggedFloat = true;
        IR::RegOpnd *const floatOpnd = m_lowererMD.CheckFloatAndUntag(src, instr, notFloatLabel);
    #else
        m_lowererMD.GenerateFloatTest(src, instr, notFloatLabel);
        IR::IndirOpnd *const floatOpnd = IR::IndirOpnd::New(src, Js::JavascriptNumber::GetValueOffset(), TyMachDouble, func);
    #endif

        //     cmp src, 0.0
        //     jp $false
        //     je/jne $target
        //     jmp $fallthrough
        InsertFloatCheckForZeroOrNanBranch(floatOpnd, branchOnFalse, labelTarget, labelFallthrough, instr);
        Lowerer::InsertBranch(Js::OpCode::Br, labelFallthrough, instr);

        // $notFloat:
        instr->InsertBefore(notFloatLabel);
        lastLabelBeforeHelper = notFloatLabel;

        src->SetValueType(srcValueType = srcValueType.SetIsNotAnyOf(ValueType::AnyNumber));
    }

    IR::LabelInstr *labelHelper = nullptr;
    bool _didObjectTest = checkedForTaggedInt && checkedForTaggedFloat;
    const auto EnsureObjectTest = [&]()
    {
        if(_didObjectTest)
        {
            return;
        }
        if(!labelHelper)
        {
            labelHelper = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        }
        m_lowererMD.GenerateObjectTest(src, instr, labelHelper);
        _didObjectTest = true;
    };

    ////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    // Boolean fast path

    if (srcValueType.HasBeenBoolean() || srcOriginalValueType.IsUninitialized())
    {
        IR::LabelInstr *notBooleanLabel = nullptr;
        if (!srcValueType.IsBoolean())
        {
            EnsureObjectTest();

            //     cmp [src], JavascriptBoolean::vtable
            //     jne $notBoolean
            notBooleanLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
            InsertCompareBranch(
                IR::IndirOpnd::New(src, 0, TyMachPtr, func),
                LoadVTableValueOpnd(instr, VTableValue::VtableJavascriptBoolean),
                Js::OpCode::BrNeq_A,
                notBooleanLabel,
                instr);
        }

        //     cmp src, false
        //     je/jne $target
        InsertCompareBranch(
            src,
            LoadLibraryValueOpnd(instr, LibraryValue::ValueFalse),
            compareWithFalseBranchToTargetOpCode,
            labelTarget,
            instr);

        if (srcValueType.IsBoolean())
        {
            // Skip lowering call to helper
            Assert(!labelHelper);
            Assert(instr->m_prev->IsBranchInstr());
            instr->Remove();
            return false;
        }
        //     jmp $fallthrough
        Lowerer::InsertBranch(Js::OpCode::Br, labelFallthrough, instr);

        if (notBooleanLabel)
        {
            instr->InsertBefore(notBooleanLabel);
            lastLabelBeforeHelper = notBooleanLabel;

        }

        src->SetValueType(srcValueType = srcValueType.SetIsNotAnyOf(ValueType::Boolean));
    }

    ////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    // String fast path

    if(srcValueType.HasBeenString())
    {
        IR::LabelInstr *notStringLabel = nullptr;
        if(!srcValueType.IsString())
        {
            EnsureObjectTest();

            notStringLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
            GenerateStringTest(src, instr, notStringLabel, nullptr, false);
        }

        //     cmp [src + offset(length)], 0
        //     jeq/jne $target
        InsertCompareBranch(
            IR::IndirOpnd::New(src, Js::JavascriptString::GetOffsetOfcharLength(), TyUint32, func),
            IR::IntConstOpnd::New(0, TyUint32, func, true),
            compareWithFalseBranchToTargetOpCode,
            labelTarget,
            instr);

        if(srcValueType.IsString())
        {
            // Skip lowering call to helper
            Assert(!labelHelper);
            Assert(instr->m_prev->IsBranchInstr());
            instr->Remove();
            return false;
        }

        //     jmp $fallthrough
        Lowerer::InsertBranch(Js::OpCode::Br, labelFallthrough, instr);

        if(notStringLabel)
        {
            instr->InsertBefore(notStringLabel);
            lastLabelBeforeHelper = notStringLabel;
        }

        src->SetValueType(srcValueType = srcValueType.SetIsNotAnyOf(ValueType::String));
    }

    ////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    // Object fast path

    if (srcValueType.IsLikelyObject())
    {
        if(srcValueType.IsObject())
        {
            if(srcValueType.GetObjectType() > ObjectType::Object)
            {
                // Specific object types that are tracked are equivalent to 'true'
                //     jmp $true
                InsertBranch(Js::OpCode::Br, labelTrue, instr);

                // Skip lowering call to helper
                Assert(!labelHelper);
                Assert(instr->m_prev->IsBranchInstr());
                instr->Remove();
                return false;
            }
        }
        else
        {
            EnsureObjectTest();
        }

        //     mov srcType, [src + offset(type)]       -- load type
        IR::RegOpnd *const srcType = IR::RegOpnd::New(TyMachPtr, func);
        const IR::AutoReuseOpnd autoReuseR1(srcType, func);
        InsertMove(srcType, IR::IndirOpnd::New(src, Js::RecyclableObject::GetOffsetOfType(), TyMachPtr, func), instr);

        //     test [srcType + offset(flags)], TypeFlagMask_IsFalsy       -- check  if falsy
        //     jnz $false
        InsertTestBranch(
            IR::IndirOpnd::New(srcType, Js::Type::GetOffsetOfFlags(), TyUint8, func),
            IR::IntConstOpnd::New(TypeFlagMask_IsFalsy, TyUint8, func),
            Js::OpCode::BrNeq_A,
            labelFalse,
            instr);

        //     cmp [srcType + offset(typeId)], TypeIds_LastJavascriptPrimitiveType  -- check base TypeIds_LastJavascriptPrimitiveType
        //     ja $true
        InsertCompareBranch(
            IR::IndirOpnd::New(srcType, Js::Type::GetOffsetOfTypeId(), TyInt32, func),
            IR::IntConstOpnd::New(Js::TypeIds_LastJavascriptPrimitiveType, TyInt32, func),
            Js::OpCode::BrGt_A,
            true /* isUnsigned */,
            labelTrue,
            instr);

        if(!labelHelper)
        {
            labelHelper = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        }
        lastLabelBeforeHelper = nullptr;
    }

    ////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    // Helper call

    // $helper:
    if(lastLabelBeforeHelper)
    {
        Assert(instr->m_prev == lastLabelBeforeHelper);
        lastLabelBeforeHelper->isOpHelper = true;
    }
    if (labelHelper)
    {
        Assert(labelHelper->isOpHelper);
        instr->InsertBefore(labelHelper);
    }

    //     call JavascriptConversion::ToBoolean
    IR::RegOpnd *const toBoolDst = IR::RegOpnd::New(TyInt32, func);
    const IR::AutoReuseOpnd autoReuseToBoolDst(toBoolDst, func);
    IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, toBoolDst, instr->GetSrc1(), func);
    instr->InsertBefore(callInstr);
    LowerUnaryHelperMem(callInstr, IR::HelperConv_ToBoolean);

    //     test eax, eax
    InsertTest(toBoolDst, toBoolDst, instr);

    //     je/jne $target
    Assert(instr->IsBranchInstr());
    instr->FreeSrc1();
    instr->m_opcode = LowererMD::MDBranchOpcode(compareWithFalseBranchToTargetOpCode);
    Assert(instr->AsBranchInstr()->GetTarget() == labelTarget);

    // Skip lowering another call to helper
    return false;
}